

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
resize(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
       *this,size_type n)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  
  if (n < this->nStored) {
    if (n == 0) {
      pmr::polymorphic_allocator<pbrt::DigitPermutation>::deallocate_object<pbrt::DigitPermutation>
                (&this->alloc,this->ptr,this->nAlloc);
      this->ptr = (DigitPermutation *)0x0;
      this->nAlloc = 0;
    }
  }
  else if (this->nStored < n) {
    reserve(this,n);
    uVar2 = this->nStored;
    lVar3 = uVar2 << 4;
    for (; uVar2 < n; uVar2 = uVar2 + 1) {
      puVar1 = (undefined8 *)((long)&this->ptr->base + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x10;
    }
  }
  this->nStored = n;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }